

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_handle.hpp
# Opt level: O1

EvictionQueue * __thiscall
duckdb::BufferPool::GetEvictionQueueForBlockHandle(BufferPool *this,BlockHandle *handle)

{
  long lVar1;
  reference this_00;
  type pEVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar3 = (ulong)handle->buffer_type;
  uVar5 = 0;
  lVar1 = 0;
  do {
    if (uVar5 == 3) break;
    if (uVar3 - 1 != uVar5) {
      lVar1 = lVar1 + (this->eviction_queue_sizes)._M_elems[uVar5];
    }
    uVar5 = uVar5 + 1;
  } while (uVar3 != uVar5);
  uVar5 = (handle->eviction_queue_idx).super___atomic_base<unsigned_long>._M_i;
  uVar3 = (this->eviction_queue_sizes)._M_elems[uVar3 - 1];
  lVar4 = 0;
  if (uVar5 < uVar3) {
    lVar4 = ~uVar5 + uVar3;
  }
  this_00 = vector<duckdb::unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>,_true>
            ::operator[](&this->queues,lVar4 + lVar1);
  pEVar2 = unique_ptr<duckdb::EvictionQueue,_std::default_delete<duckdb::EvictionQueue>,_true>::
           operator*(this_00);
  return pEVar2;
}

Assistant:

FileBufferType GetBufferType() const {
		return buffer_type;
	}